

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void c4::yml::anon_unknown_0::_resolve_tags(Tree *t,size_t node)

{
  NodeType_e NVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  ulong node_00;
  csubstr *pcVar5;
  size_t in_R8;
  csubstr tag;
  csubstr cVar6;
  
  node_00 = Tree::first_child(t,node);
  do {
    if (node_00 == 0xffffffffffffffff) {
      return;
    }
    if (t->m_cap <= node_00) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
      (*(code *)PTR_error_impl_00247a78)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    NVar1 = t->m_buf[node_00].m_type.type;
    uVar4 = (uint)NVar1;
    if ((NVar1 & KEY) != NOTYPE) {
      if (t->m_cap <= node_00) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
        (*(code *)PTR_error_impl_00247a78)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
        uVar4 = (uint)t->m_buf[node_00].m_type.type;
      }
      if ((~uVar4 & 0x402) == 0) {
        pcVar5 = Tree::key_tag(t,node_00);
        cVar6.len = node_00;
        cVar6.str = (char *)pcVar5->len;
        cVar6 = _transform_tag((anon_unknown_0 *)t,(Tree *)pcVar5->str,cVar6,in_R8);
        Tree::set_key_tag(t,node_00,cVar6);
      }
    }
    if (t->m_cap <= node_00) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
      (*(code *)PTR_error_impl_00247a78)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    NVar1 = t->m_buf[node_00].m_type.type;
    uVar4 = (uint)NVar1;
    if ((NVar1 & VAL) != NOTYPE) {
      if (t->m_cap <= node_00) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
        (*(code *)PTR_error_impl_00247a78)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
        uVar4 = (uint)t->m_buf[node_00].m_type.type;
      }
      if ((uVar4 & 0xd) != 0 && (uVar4 >> 0xb & 1) != 0) {
        pcVar5 = Tree::val_tag(t,node_00);
        tag.len = node_00;
        tag.str = (char *)pcVar5->len;
        cVar6 = _transform_tag((anon_unknown_0 *)t,(Tree *)pcVar5->str,tag,in_R8);
        Tree::set_val_tag(t,node_00,cVar6);
      }
    }
    _resolve_tags(t,node_00);
    node_00 = Tree::next_sibling(t,node_00);
  } while( true );
}

Assistant:

void _resolve_tags(Tree *t, size_t node)
{
    for(size_t child = t->first_child(node); child != NONE; child = t->next_sibling(child))
    {
        if(t->has_key(child) && t->has_key_tag(child))
            t->set_key_tag(child, _transform_tag(t, t->key_tag(child), child));
        if(t->has_val(child) && t->has_val_tag(child))
            t->set_val_tag(child, _transform_tag(t, t->val_tag(child), child));
        _resolve_tags(t, child);
    }
}